

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

AddrRange * addrrange_intersection(AddrRange r1,AddrRange r2)

{
  undefined1 a [16];
  undefined1 b [16];
  Int128 *pIVar1;
  long extraout_RDX;
  undefined8 unaff_RBX;
  AddrRange *in_RDI;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  undefined8 unaff_retaddr;
  Int128 *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  
  if ((SBORROW8((long)r1.size,in_stack_00000010) !=
      SBORROW8((long)r1.size - in_stack_00000010,(ulong)(r1.start._8_8_ < in_stack_00000008))) !=
      (long)(((long)r1.size - in_stack_00000010) - (ulong)(r1.start._8_8_ < in_stack_00000008)) < 0)
  {
    r1.start._8_8_ = in_stack_00000008;
    r1.size._0_8_ = in_stack_00000010;
  }
  a._8_8_ = unaff_R14;
  a._0_8_ = unaff_RBX;
  b._8_8_ = unaff_retaddr;
  b._0_8_ = unaff_R15;
  pIVar1 = int128_min((Int128 *)((long)in_stack_00000008 + in_stack_00000018),(Int128)a,(Int128)b);
  *(long *)((long)&in_RDI->start + 8) = (long)r1.size;
  *(Int128 **)&in_RDI->start = r1.start._8_8_;
  *(long *)&in_RDI->size = (long)pIVar1 - (long)r1.start._8_8_;
  *(ulong *)((long)&in_RDI->size + 8) =
       (extraout_RDX - (ulong)(pIVar1 < r1.start._8_8_)) - (long)r1.size;
  return in_RDI;
}

Assistant:

static AddrRange addrrange_intersection(AddrRange r1, AddrRange r2)
{
    Int128 start = int128_max(r1.start, r2.start);
    Int128 end = int128_min(addrrange_end(r1), addrrange_end(r2));
    return addrrange_make(start, int128_sub(end, start));
}